

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DesignatorPdu.cpp
# Opt level: O2

void __thiscall DIS::DesignatorPdu::DesignatorPdu(DesignatorPdu *this)

{
  DistributedEmissionsFamilyPdu::DistributedEmissionsFamilyPdu
            (&this->super_DistributedEmissionsFamilyPdu);
  (this->super_DistributedEmissionsFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__DesignatorPdu_001b0a58;
  EntityID::EntityID(&this->_designatingEntityID);
  this->_codeName = 0;
  EntityID::EntityID(&this->_designatedEntityID);
  this->_designatorCode = 0;
  this->_designatorPower = 0.0;
  this->_designatorWavelength = 0.0;
  Vector3Float::Vector3Float(&this->_designatorSpotWrtDesignated);
  Vector3Double::Vector3Double(&this->_designatorSpotLocation);
  this->_deadReckoningAlgorithm = '\0';
  this->_padding1 = 0;
  this->_padding2 = '\0';
  Vector3Float::Vector3Float(&this->_entityLinearAcceleration);
  Pdu::setPduType((Pdu *)this,'\x18');
  return;
}

Assistant:

DesignatorPdu::DesignatorPdu() : DistributedEmissionsFamilyPdu(),
   _designatingEntityID(), 
   _codeName(0), 
   _designatedEntityID(), 
   _designatorCode(0), 
   _designatorPower(0.0), 
   _designatorWavelength(0.0), 
   _designatorSpotWrtDesignated(), 
   _designatorSpotLocation(), 
   _deadReckoningAlgorithm(0), 
   _padding1(0), 
   _padding2(0), 
   _entityLinearAcceleration()
{
    setPduType( 24 );
}